

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

ImageChannelValues * __thiscall
pbrt::Image::Bilerp(ImageChannelValues *__return_storage_ptr__,Image *this,Point2f p,
                   WrapMode2D wrapMode)

{
  size_t sVar1;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar2;
  long lVar3;
  Float FVar4;
  float local_4c;
  Tuple2<pbrt::Point2,_float> local_48;
  polymorphic_allocator<float> local_30;
  
  sVar1 = (this->channelNames).nStored;
  local_4c = 0.0;
  local_48 = p.super_Tuple2<pbrt::Point2,_float>;
  local_30.memoryResource = pstd::pmr::new_delete_resource();
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
            (&__return_storage_ptr__->
              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,
             (long)(int)sVar1,&local_4c,&local_30);
  if (0 < (int)(this->channelNames).nStored) {
    lVar3 = 0;
    do {
      FVar4 = BilerpChannel(this,(Point2f)local_48,(int)lVar3,wrapMode);
      paVar2 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                *)(__return_storage_ptr__->
                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
      if (paVar2 == (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                     *)0x0) {
        paVar2 = &(__return_storage_ptr__->
                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
      }
      paVar2->fixed[lVar3] = FVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (int)(this->channelNames).nStored);
  }
  return __return_storage_ptr__;
}

Assistant:

ImageChannelValues Image::Bilerp(Point2f p, WrapMode2D wrapMode) const {
    ImageChannelValues cv(NChannels(), Float(0));
    for (int c = 0; c < NChannels(); ++c)
        cv[c] = BilerpChannel(p, c, wrapMode);
    return cv;
}